

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugContext.cpp
# Opt level: O1

void __thiscall Js::DebugContext::Initialize(DebugContext *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HeapAllocator *alloc;
  ProbeContainer *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if (this->diagProbesContainer != (ProbeContainer *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
                                ,0x1f,"(this->diagProbesContainer == nullptr)",
                                "this->diagProbesContainer == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_48 = (undefined1  [8])&ProbeContainer::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_3bd7c39;
  data.filename._0_4_ = 0x20;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_48);
  this_00 = (ProbeContainer *)new<Memory::HeapAllocator>(0x70,alloc,0x300d4a);
  ProbeContainer::ProbeContainer(this_00);
  this->diagProbesContainer = this_00;
  ProbeContainer::Initialize(this_00,this->scriptContext);
  return;
}

Assistant:

void DebugContext::Initialize()
    {
        Assert(this->diagProbesContainer == nullptr);
        this->diagProbesContainer = HeapNew(ProbeContainer);
        this->diagProbesContainer->Initialize(this->scriptContext);
    }